

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaveinfo.c
# Opt level: O2

int si_map_sii(int slave)

{
  int iVar1;
  int iVar2;
  
  puts("PDO mapping according to SII :");
  iVar1 = si_siiPDO((uint16)slave,'\x01',*(int *)((long)slave * 0x148 + 0x117118) + -0x1151a0,0);
  iVar2 = si_siiPDO((uint16)slave,'\0',*(int *)((long)slave * 0x148 + 0x117128) + -0x1151a0,0);
  return (int)(0 < iVar2 || 0 < iVar1);
}

Assistant:

int si_map_sii(int slave)
{
    int retVal = 0;
    int Tsize, outputs_bo, inputs_bo;

    printf("PDO mapping according to SII :\n");

    outputs_bo = 0;
    inputs_bo = 0;
    /* read the assign RXPDOs */
    Tsize = si_siiPDO(slave, 1, (int)(ec_slave[slave].outputs - (uint8*)&IOmap), outputs_bo );
    outputs_bo += Tsize;
    /* read the assign TXPDOs */
    Tsize = si_siiPDO(slave, 0, (int)(ec_slave[slave].inputs - (uint8*)&IOmap), inputs_bo );
    inputs_bo += Tsize;
    /* found some I/O bits ? */
    if ((outputs_bo > 0) || (inputs_bo > 0))
        retVal = 1;
    return retVal;
}